

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLParser.cxx
# Opt level: O2

int __thiscall cmXMLParser::CleanupParser(cmXMLParser *this)

{
  XML_Status XVar1;
  ostream *poVar2;
  int iVar3;
  
  if ((XML_Parser)this->Parser == (XML_Parser)0x0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Parser not initialized");
    std::endl<char,std::char_traits<char>>(poVar2);
    this->ParseError = 1;
    iVar3 = 0;
  }
  else {
    iVar3 = 0;
    if (this->ParseError == 0) {
      iVar3 = 1;
      XVar1 = XML_Parse((XML_Parser)this->Parser,"",0,1);
      if (XVar1 == XML_STATUS_ERROR) {
        (*this->_vptr_cmXMLParser[0xb])(this);
        iVar3 = 0;
      }
    }
    XML_ParserFree((XML_Parser)this->Parser);
    this->Parser = (void *)0x0;
  }
  return iVar3;
}

Assistant:

int cmXMLParser::CleanupParser()
{
  if (!this->Parser) {
    std::cerr << "Parser not initialized" << std::endl;
    this->ParseError = 1;
    return 0;
  }
  int result = !this->ParseError;
  if (result) {
    // Tell the expat XML parser about the end-of-input.
    if (!XML_Parse(static_cast<XML_Parser>(this->Parser), "", 0, 1)) {
      this->ReportXmlParseError();
      result = 0;
    }
  }

  // Clean up the parser.
  XML_ParserFree(static_cast<XML_Parser>(this->Parser));
  this->Parser = nullptr;

  return result;
}